

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::SqlGenerator(SqlGenerator *this,shared_ptr<Launcher> *launcher)

{
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__SqlGenerator_0021ecc0;
  (this->_pathToData)._M_dataplus._M_p = (pointer)&(this->_pathToData).field_2;
  (this->_pathToData)._M_string_length = 0;
  (this->_pathToData).field_2._M_local_buf[0] = '\0';
  (this->_outputDirectory)._M_dataplus._M_p = (pointer)&(this->_outputDirectory).field_2;
  (this->_outputDirectory)._M_string_length = 0;
  (this->_outputDirectory).field_2._M_local_buf[0] = '\0';
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_app).super___shared_ptr<Application,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_app).super___shared_ptr<Application,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Launcher::getTreeDecomposition((Launcher *)&stack0xffffffffffffffd0);
  std::__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  Launcher::getCompiler((Launcher *)&stack0xffffffffffffffd0);
  std::__shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  Launcher::getApplication((Launcher *)&stack0xffffffffffffffd0);
  std::__shared_ptr<Application,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_app).super___shared_ptr<Application,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Application,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

SqlGenerator::SqlGenerator(std::shared_ptr<Launcher> launcher) 
{
     DINFO("Constructing SQL - Generator \n");
   
    _td = launcher->getTreeDecomposition();
    _qc = launcher->getCompiler();
    _app = launcher->getApplication();    
}